

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O3

uint64_t absl::lts_20250127::hash_internal::CityHash64(char *s,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  
  if (0x20 < len) {
    if (len < 0x41) {
      lVar4 = len * 2 + -0x651e95c4d06fbfb1;
      lVar11 = *(long *)(s + (len - 0x18));
      uVar8 = *(ulong *)(s + 8);
      lVar13 = *(long *)(s + 0x18) * 9;
      uVar2 = *(long *)s * -0x651e95c4d06fbfb1 + *(long *)(s + (len - 8));
      uVar1 = *(long *)(s + 0x10) * -0x651e95c4d06fbfb1 + lVar13;
      uVar10 = uVar2 ^ *(ulong *)(s + (len - 0x20));
      uVar2 = (uVar10 + lVar13 + 1 +
              ((uVar8 << 0x22 | uVar8 >> 0x1e) + lVar11) * 9 + (uVar2 * 0x200000 | uVar2 >> 0x2b)) *
              lVar4;
      lVar9 = (uVar1 * 0x400000 | uVar1 >> 0x2a) + lVar11;
      uVar2 = (*(long *)(s + (len - 0x10)) * lVar4 + lVar13 + uVar10 + 1 +
              (uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18
               | (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
               (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38)) * lVar4;
      uVar2 = (*(long *)(s + (len - 8)) + uVar1 + lVar11 + lVar9 +
              (uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18
               | (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
               (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38)) * lVar4;
      uVar8 = *(long *)(s + (len - 0x10)) * lVar4 + *(ulong *)(s + (len - 0x20)) +
              (uVar1 + lVar11 + uVar8 +
              (uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18
               | (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
               (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38)) * lVar4;
      uVar3 = (uVar8 >> 0x2f ^ uVar8) * lVar4 + lVar9;
    }
    else {
      lVar4 = *(long *)(s + (len - 0x28));
      uVar8 = *(long *)(s + (len - 0x38)) + *(long *)(s + (len - 0x10));
      uVar1 = *(ulong *)(s + (len - 0x18));
      uVar2 = (*(long *)(s + (len - 0x30)) + len ^ uVar1) * -0x622015f714c7d297;
      uVar2 = (uVar2 >> 0x2f ^ uVar1 ^ uVar2) * -0x622015f714c7d297;
      uVar2 = (uVar2 >> 0x2f ^ uVar2) * -0x622015f714c7d297;
      lVar11 = *(long *)(s + (len - 0x40)) + len;
      uVar7 = lVar4 + lVar11 + uVar2;
      uVar10 = *(long *)(s + (len - 0x38)) + *(long *)(s + (len - 0x30)) + lVar11;
      uVar6 = uVar10 + lVar4;
      uVar10 = (uVar10 * 0x100000 | uVar10 >> 0x2c) + lVar11 + (uVar7 << 0x2b | uVar7 >> 0x15);
      lVar11 = *(long *)(s + (len - 0x20)) + uVar8 + -0x4b6d499041670d8d;
      uVar14 = lVar4 + *(long *)(s + (len - 8)) + lVar11;
      uVar1 = uVar1 + *(long *)(s + (len - 0x10)) + lVar11;
      uVar7 = uVar1 + *(long *)(s + (len - 8));
      lVar4 = lVar4 * -0x4b6d499041670d8d + *(long *)s;
      uVar1 = (uVar1 * 0x100000 | uVar1 >> 0x2c) + lVar11 + (uVar14 << 0x2b | uVar14 >> 0x15);
      uVar14 = 0;
      do {
        uVar5 = lVar4 + uVar6 + uVar8 + *(long *)(s + uVar14 + 8);
        uVar8 = uVar8 + uVar10 + *(long *)(s + uVar14 + 0x30);
        uVar12 = (uVar5 * 0x8000000 | uVar5 >> 0x25) * -0x4b6d499041670d8d ^ uVar1;
        uVar8 = uVar6 + *(long *)(s + uVar14 + 0x28) +
                (uVar8 * 0x400000 | uVar8 >> 0x2a) * -0x4b6d499041670d8d;
        lVar4 = ((uVar2 + uVar7) * 0x80000000 | uVar2 + uVar7 >> 0x21) * -0x4b6d499041670d8d;
        lVar11 = uVar10 * -0x4b6d499041670d8d + *(long *)(s + uVar14);
        uVar2 = *(long *)(s + uVar14 + 8) + *(long *)(s + uVar14 + 0x10) + lVar11;
        uVar6 = uVar2 + *(long *)(s + uVar14 + 0x18);
        lVar13 = uVar1 + lVar4 + *(long *)(s + uVar14 + 0x20);
        uVar5 = *(long *)(s + uVar14 + 0x10) + uVar8 + lVar13 + *(long *)(s + uVar14 + 0x38);
        uVar1 = uVar7 + lVar11 + *(long *)(s + uVar14 + 0x18) + uVar12;
        uVar10 = lVar11 + (uVar2 * 0x100000 | uVar2 >> 0x2c) + (uVar1 << 0x2b | uVar1 >> 0x15);
        uVar1 = *(long *)(s + uVar14 + 0x28) + *(long *)(s + uVar14 + 0x30) + lVar13;
        uVar7 = uVar1 + *(long *)(s + uVar14 + 0x38);
        uVar1 = lVar13 + (uVar1 * 0x100000 | uVar1 >> 0x2c) + (uVar5 << 0x2b | uVar5 >> 0x15);
        uVar14 = uVar14 + 0x40;
        uVar2 = uVar12;
      } while ((len - 1 & 0xffffffffffffffc0) != uVar14);
      uVar2 = (uVar6 ^ uVar7) * -0x622015f714c7d297;
      uVar2 = (uVar2 >> 0x2f ^ uVar7 ^ uVar2) * -0x622015f714c7d297;
      uVar10 = (uVar10 ^ uVar1) * -0x622015f714c7d297;
      uVar1 = (uVar10 >> 0x2f ^ uVar1 ^ uVar10) * -0x622015f714c7d297;
      uVar1 = (uVar1 >> 0x2f ^ uVar1) * -0x622015f714c7d297 + lVar4;
      uVar8 = ((uVar8 >> 0x2f ^ uVar8) * -0x4b6d499041670d8d + uVar12 +
               (uVar2 >> 0x2f ^ uVar2) * -0x622015f714c7d297 ^ uVar1) * -0x622015f714c7d297;
      uVar8 = (uVar8 >> 0x2f ^ uVar1 ^ uVar8) * -0x622015f714c7d297;
      uVar3 = (uVar8 >> 0x2f ^ uVar8) * -0x622015f714c7d297;
    }
    return uVar3;
  }
  if (len < 0x11) {
    if (len < 8) {
      if (len < 4) {
        if (len == 0) {
          return 0x9ae16a3b2f90404f;
        }
        uVar8 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
        return (uVar8 >> 0x2f ^ uVar8) * -0x651e95c4d06fbfb1;
      }
      lVar4 = len * 2 + -0x651e95c4d06fbfb1;
      uVar8 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar4;
      uVar8 = (uVar8 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar8) * lVar4;
      uVar8 = uVar8 >> 0x2f ^ uVar8;
    }
    else {
      lVar4 = len * 2 + -0x651e95c4d06fbfb1;
      uVar1 = *(long *)s + 0x9ae16a3b2f90404f;
      uVar8 = *(ulong *)(s + (len - 8));
      uVar2 = ((uVar1 << 0x27 | uVar1 >> 0x19) + uVar8) * lVar4;
      uVar8 = ((uVar8 << 0x1b | uVar8 >> 0x25) * lVar4 + uVar1 ^ uVar2) * lVar4;
      uVar8 = (uVar8 >> 0x2f ^ uVar2 ^ uVar8) * lVar4;
      uVar8 = uVar8 >> 0x2f ^ uVar8;
    }
  }
  else {
    lVar4 = len * 2 + -0x651e95c4d06fbfb1;
    uVar2 = *(long *)(s + (len - 8)) * lVar4;
    uVar8 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
    uVar1 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
    uVar1 = (uVar1 << 0x2e | uVar1 >> 0x12) + *(long *)s * -0x4b6d499041670d8d + uVar2;
    uVar8 = ((uVar2 << 0x22 | uVar2 >> 0x1e) + (uVar8 * 0x200000 | uVar8 >> 0x2b) +
             *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1 ^ uVar1) * lVar4;
    uVar8 = (uVar8 >> 0x2f ^ uVar1 ^ uVar8) * lVar4;
    uVar8 = uVar8 >> 0x2f ^ uVar8;
  }
  return uVar8 * lVar4;
}

Assistant:

uint64_t CityHash64(const char *s, size_t len) {
  if (len <= 32) {
    if (len <= 16) {
      return HashLen0to16(s, len);
    } else {
      return HashLen17to32(s, len);
    }
  } else if (len <= 64) {
    return HashLen33to64(s, len);
  }

  // For strings over 64 bytes we hash the end first, and then as we
  // loop we keep 56 bytes of state: v, w, x, y, and z.
  uint64_t x = Fetch64(s + len - 40);
  uint64_t y = Fetch64(s + len - 16) + Fetch64(s + len - 56);
  uint64_t z = HashLen16(Fetch64(s + len - 48) + len, Fetch64(s + len - 24));
  std::pair<uint64_t, uint64_t> v =
      WeakHashLen32WithSeeds(s + len - 64, len, z);
  std::pair<uint64_t, uint64_t> w =
      WeakHashLen32WithSeeds(s + len - 32, y + k1, x);
  x = x * k1 + Fetch64(s);

  // Decrease len to the nearest multiple of 64, and operate on 64-byte chunks.
  len = (len - 1) & ~static_cast<size_t>(63);
  do {
    x = Rotate(x + y + v.first + Fetch64(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch64(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch64(s + 16));
    std::swap(z, x);
    s += 64;
    len -= 64;
  } while (len != 0);
  return HashLen16(HashLen16(v.first, w.first) + ShiftMix(y) * k1 + z,
                   HashLen16(v.second, w.second) + x);
}